

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void duckdb::MergeJoinPinSortingBlock(SBScanState *scan,idx_t block_idx)

{
  type sd;
  
  SBScanState::SetIndices(scan,block_idx,0);
  SBScanState::PinRadix(scan,block_idx);
  sd = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator*
                 (&scan->sb->blob_sorting_data);
  if (block_idx <
      (ulong)((long)(sd->data_blocks).
                    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(sd->data_blocks).
                    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    SBScanState::PinData(scan,sd);
    return;
  }
  return;
}

Assistant:

static void MergeJoinPinSortingBlock(SBScanState &scan, const idx_t block_idx) {
	scan.SetIndices(block_idx, 0);
	scan.PinRadix(block_idx);

	auto &sd = *scan.sb->blob_sorting_data;
	if (block_idx < sd.data_blocks.size()) {
		scan.PinData(sd);
	}
}